

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O3

void __thiscall
OpenMD::SelectionEvaluator::compareProperty
          (SelectionEvaluator *this,Molecule *mol,SelectionSet *bs,int property,int comparator,
          float comparisonValue)

{
  ulong *puVar1;
  double dVar2;
  int iVar3;
  Atom *atom;
  uint i;
  long lVar4;
  int iVar5;
  pointer ppAVar6;
  RealType RVar7;
  double dVar8;
  Vector3d pos;
  Vector3d local_58;
  Vector3d local_40;
  
  local_58.super_Vector<double,_3U>.data_[0] = 0.0;
  local_58.super_Vector<double,_3U>.data_[1] = 0.0;
  local_58.super_Vector<double,_3U>.data_[2] = 0.0;
  switch(property) {
  case 0x1c00:
    dVar8 = Molecule::getMass(mol);
    break;
  case 0x1c01:
    ppAVar6 = (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    dVar8 = 0.0;
    if (ppAVar6 !=
        (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      atom = *ppAVar6;
      while (atom != (Atom *)0x0) {
        ppAVar6 = ppAVar6 + 1;
        RVar7 = getCharge(this,atom);
        dVar8 = RVar7 + dVar8;
        if (ppAVar6 ==
            (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) break;
        atom = *ppAVar6;
      }
    }
    break;
  case 0x1c02:
    Molecule::getCom(&local_40,mol);
    dVar8 = local_40.super_Vector<double,_3U>.data_[0];
    break;
  case 0x1c03:
    Molecule::getCom(&local_40,mol);
    dVar8 = local_40.super_Vector<double,_3U>.data_[1];
    break;
  case 0x1c04:
    Molecule::getCom(&local_40,mol);
    dVar8 = local_40.super_Vector<double,_3U>.data_[2];
    break;
  case 0x1c05:
    Molecule::getCom(&local_40,mol);
    dVar8 = 0.0;
    lVar4 = 0;
    do {
      dVar2 = local_40.super_Vector<double,_3U>.data_[lVar4];
      dVar8 = dVar8 + dVar2 * dVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    break;
  case 0x1c06:
    Molecule::getCom(&local_58,mol);
    Snapshot::wrapVector(this->info->sman_->currentSnapshot_,&local_58);
    dVar8 = local_58.super_Vector<double,_3U>.data_[0];
    break;
  case 0x1c07:
    Molecule::getCom(&local_58,mol);
    Snapshot::wrapVector(this->info->sman_->currentSnapshot_,&local_58);
    dVar8 = local_58.super_Vector<double,_3U>.data_[1];
    break;
  case 0x1c08:
    Molecule::getCom(&local_58,mol);
    Snapshot::wrapVector(this->info->sman_->currentSnapshot_,&local_58);
    dVar8 = local_58.super_Vector<double,_3U>.data_[2];
    break;
  default:
    unrecognizedMoleculeProperty(this,property);
    dVar8 = 0.0;
  }
  switch(comparator) {
  case 0x3400:
    if (dVar8 <= (double)comparisonValue) {
      return;
    }
    break;
  case 0x3401:
    if (dVar8 < (double)comparisonValue) {
      return;
    }
    break;
  case 0x3402:
    dVar2 = (double)comparisonValue;
    goto LAB_00262d96;
  case 0x3403:
    if ((double)comparisonValue <= dVar8) {
      return;
    }
    break;
  case 0x3404:
    dVar8 = ABS(dVar8 - (double)comparisonValue);
    dVar2 = 1e-06;
LAB_00262d96:
    if (dVar2 < dVar8) {
      return;
    }
    break;
  case 0x3405:
    if ((dVar8 == (double)comparisonValue) && (!NAN(dVar8) && !NAN((double)comparisonValue))) {
      return;
    }
    break;
  default:
    goto switchD_00262d5b_default;
  }
  iVar3 = mol->globalIndex_;
  iVar5 = iVar3 + 0x3f;
  if (-1 < (long)iVar3) {
    iVar5 = iVar3;
  }
  puVar1 = (ulong *)((long)(iVar5 >> 6) * 8 +
                     *(long *)&(bs->bitsets_).
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start[5].bitset_.
                               super__Bvector_base<std::allocator<bool>_> + -8 +
                    (ulong)(((long)iVar3 & 0x800000000000003fU) < 0x8000000000000001) * 8);
  *puVar1 = *puVar1 | 1L << ((byte)iVar3 & 0x3f);
switchD_00262d5b_default:
  return;
}

Assistant:

void SelectionEvaluator::compareProperty(Molecule* mol, SelectionSet& bs,
                                           int property, int comparator,
                                           float comparisonValue) {
    RealType propertyValue = 0.0;
    Vector3d pos;

    switch (property) {
    case Token::mass:
      propertyValue = mol->getMass();
      break;
    case Token::charge: {
      Molecule::AtomIterator ai;
      Atom* atom;
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        propertyValue += getCharge(atom);
      }
    } break;
    case Token::x:
      propertyValue = mol->getCom().x();
      break;
    case Token::y:
      propertyValue = mol->getCom().y();
      break;
    case Token::z:
      propertyValue = mol->getCom().z();
      break;
    case Token::wrappedX:
      pos = mol->getCom();
      info->getSnapshotManager()->getCurrentSnapshot()->wrapVector(pos);
      propertyValue = pos.x();
      break;
    case Token::wrappedY:
      pos = mol->getCom();
      info->getSnapshotManager()->getCurrentSnapshot()->wrapVector(pos);
      propertyValue = pos.y();
      break;
    case Token::wrappedZ:
      pos = mol->getCom();
      info->getSnapshotManager()->getCurrentSnapshot()->wrapVector(pos);
      propertyValue = pos.z();
      break;
    case Token::r:
      propertyValue = mol->getCom().length();
      break;
    default:
      unrecognizedMoleculeProperty(property);
    }

    bool match = false;
    switch (comparator) {
    case Token::opLT:
      match = propertyValue < comparisonValue;
      break;
    case Token::opLE:
      match = propertyValue <= comparisonValue;
      break;
    case Token::opGE:
      match = propertyValue >= comparisonValue;
      break;
    case Token::opGT:
      match = propertyValue > comparisonValue;
      break;
    case Token::opEQ:
      match = fabs(propertyValue - comparisonValue) <= OpenMD::epsilon;
      break;
    case Token::opNE:
      match = propertyValue != comparisonValue;
      break;
    }

    if (match) bs.bitsets_[MOLECULE].setBitOn(mol->getGlobalIndex());
  }